

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_dehydrate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = is_npc((CHAR_DATA *)vo);
  if ((!bVar1) && (0x32 < *(short *)(*(long *)((long)vo + 0xc0) + 0x3e0))) {
    act("$N is already too dehydrated to be affected.",ch,(void *)0x0,vo,3);
    return;
  }
  act("You attempt to draw fluids from $N\'s body.",ch,(void *)0x0,vo,3);
  act("A wave of nausea overcomes you as your gut clenches and sweat gushes from your pores.\n\rYou feel desperately thirsty."
      ,ch,(void *)0x0,vo,2);
  act("$N doubles over in agony as rolls of sweat drip from $S body.",ch,(void *)0x0,vo,1);
  bVar1 = is_npc((CHAR_DATA *)vo);
  if (bVar1) {
    iVar2 = dice(level,3);
    damage_new(ch,(CHAR_DATA *)vo,iVar2,sn,0x14,true,false,0,1,(char *)0x0);
  }
  else {
    iVar2 = dice(0x32 - *(short *)(*(long *)((long)vo + 0xc0) + 0x3e0),level / 5);
    damage_new(ch,(CHAR_DATA *)vo,iVar2,sn,0x14,true,false,0,1,(char *)0x0);
    if (-1 < *(short *)(*(long *)((long)vo + 0xc0) + 0x3e0)) {
      *(undefined2 *)(*(long *)((long)vo + 0xc0) + 0x3e0) = 0x32;
    }
  }
  return;
}

Assistant:

void spell_dehydrate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (!is_npc(victim) && victim->pcdata->condition[COND_THIRST] > COND_HUNGRY)
	{
		act("$N is already too dehydrated to be affected.", ch, 0, victim, TO_CHAR);
		return;
	}

	act("You attempt to draw fluids from $N's body.", ch, 0, victim, TO_CHAR);
	act("A wave of nausea overcomes you as your gut clenches and sweat gushes from your pores.\n\rYou feel desperately thirsty.", ch, 0, victim, TO_VICT);
	act("$N doubles over in agony as rolls of sweat drip from $S body.", ch, 0, victim, TO_NOTVICT);

	if (is_npc(victim))
	{
		damage_new(ch, victim, dice(level, 3), sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	}
	else
	{
		damage_new(ch, victim, dice(COND_HUNGRY - victim->pcdata->condition[COND_THIRST], level / 5), sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

		if (victim->pcdata->condition[COND_THIRST] >= 0)
			victim->pcdata->condition[COND_THIRST] = COND_HUNGRY;
	}
}